

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

parameter * __thiscall
clipp::command<char_const(&)[13]>(parameter *__return_storage_ptr__,clipp *this,char (*flag) [13])

{
  allocator local_131;
  arg_string local_130;
  parameter local_110;
  
  std::__cxx11::string::string((string *)&local_130,(char *)this,&local_131);
  parameter::parameter<>(&local_110,&local_130);
  local_110.required_ = true;
  local_110.super_token<clipp::parameter>.repeatable_ = false;
  local_110.super_token<clipp::parameter>.blocking_ = true;
  parameter::parameter(__return_storage_ptr__,&local_110);
  parameter::~parameter(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

inline parameter
command(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(true).blocking(true).repeatable(false);
}